

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall Assembler::processGlobalSecondPass(Assembler *this,string *line)

{
  bool bVar1;
  NotDefGlobalSecondPassError *this_00;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
  local_30;
  _Self local_28;
  _Self local_20;
  string *local_18;
  string *line_local;
  Assembler *this_local;
  
  local_18 = line;
  line_local = &this->inputFileName;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
       ::find(&this->symbolTable,line);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
       ::end(&this->symbolTable);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
         ::find(&this->symbolTable,line);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
             ::operator->(&local_30);
    (ppVar2->second).isGlobal = true;
    return;
  }
  this_00 = (NotDefGlobalSecondPassError *)__cxa_allocate_exception(8);
  memset(this_00,0,8);
  NotDefGlobalSecondPassError::NotDefGlobalSecondPassError(this_00);
  __cxa_throw(this_00,&NotDefGlobalSecondPassError::typeinfo,
              NotDefGlobalSecondPassError::~NotDefGlobalSecondPassError);
}

Assistant:

void Assembler::processGlobalSecondPass(string line) {
    if (symbolTable.find(line) == symbolTable.end()) throw NotDefGlobalSecondPassError();
    symbolTable.find(line)->second.isGlobal = true;
}